

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# personal_settings.cpp
# Opt level: O0

void __thiscall
PersonalSettings::PersonalSettings
          (PersonalSettings *this,ArgumentDictionary *args,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
          *item_names)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  *pmVar1;
  bool bVar2;
  Color CVar3;
  pair<Color,_Color> pVar4;
  ostream *poVar5;
  allocator<char> local_469;
  string local_468;
  allocator<char> local_441;
  string local_440;
  undefined1 local_420 [8];
  string nigel_color_as_string;
  string local_3f8;
  Color local_3d5;
  allocator<char> local_3d1;
  string local_3d0;
  allocator<char> local_3a9;
  string local_3a8;
  undefined1 local_388 [8];
  string hud_color_as_string;
  string local_360;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  string local_310;
  undefined1 local_2f0 [8];
  Json settings_json;
  ifstream personal_settings_file;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  undefined1 local_88 [8];
  string settings_path;
  Color local_34;
  Color local_30 [4];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  *local_20;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  *item_names_local;
  ArgumentDictionary *args_local;
  PersonalSettings *this_local;
  
  local_20 = item_names;
  item_names_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
        *)args;
  args_local = (ArgumentDictionary *)this;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  ::map(&this->_item_names);
  this->_add_ingame_item_tracker = false;
  Color::Color(&this->_hud_color,'@',' ',0x80);
  Color::Color(local_30,'\0',0xa0,0x80);
  Color::Color(&local_34,'\0','@',' ');
  pVar4 = std::make_pair<Color,Color>(local_30,&local_34);
  this->_nigel_colors = pVar4;
  this->_remove_music = false;
  this->_swap_overworld_music = false;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  ::operator=(&this->_item_names,local_20);
  pmVar1 = item_names_local;
  settings_path.field_2._8_8_ = 0x122e13142d002423;
  (this->_inventory_order)._M_elems[0x20] = '\x1e';
  (this->_inventory_order)._M_elems[0x21] = '\x19';
  (this->_inventory_order)._M_elems[0x22] = '\x1a';
  (this->_inventory_order)._M_elems[0x23] = ' ';
  (this->_inventory_order)._M_elems[0x24] = '\x1d';
  (this->_inventory_order)._M_elems[0x25] = '5';
  (this->_inventory_order)._M_elems[0x26] = '\x18';
  (this->_inventory_order)._M_elems[0x27] = 0xff;
  (this->_inventory_order)._M_elems[0x10] = '8';
  (this->_inventory_order)._M_elems[0x11] = '9';
  (this->_inventory_order)._M_elems[0x12] = ',';
  (this->_inventory_order)._M_elems[0x13] = '\x16';
  (this->_inventory_order)._M_elems[0x14] = '6';
  (this->_inventory_order)._M_elems[0x15] = ')';
  (this->_inventory_order)._M_elems[0x16] = '0';
  (this->_inventory_order)._M_elems[0x17] = '\'';
  (this->_inventory_order)._M_elems[0x18] = '(';
  (this->_inventory_order)._M_elems[0x19] = '*';
  (this->_inventory_order)._M_elems[0x1a] = '4';
  (this->_inventory_order)._M_elems[0x1b] = '!';
  (this->_inventory_order)._M_elems[0x1c] = '\"';
  (this->_inventory_order)._M_elems[0x1d] = '3';
  (this->_inventory_order)._M_elems[0x1e] = '\x17';
  (this->_inventory_order)._M_elems[0x1f] = '\x1f';
  (this->_inventory_order)._M_elems[0] = '#';
  (this->_inventory_order)._M_elems[1] = '$';
  (this->_inventory_order)._M_elems[2] = '\0';
  (this->_inventory_order)._M_elems[3] = '-';
  (this->_inventory_order)._M_elems[4] = '\x14';
  (this->_inventory_order)._M_elems[5] = '\x13';
  (this->_inventory_order)._M_elems[6] = '.';
  (this->_inventory_order)._M_elems[7] = '\x12';
  (this->_inventory_order)._M_elems[8] = '\x15';
  (this->_inventory_order)._M_elems[9] = '\x1c';
  (this->_inventory_order)._M_elems[10] = '2';
  (this->_inventory_order)._M_elems[0xb] = '1';
  (this->_inventory_order)._M_elems[0xc] = '\x1b';
  (this->_inventory_order)._M_elems[0xd] = '/';
  (this->_inventory_order)._M_elems[0xe] = '+';
  (this->_inventory_order)._M_elems[0xf] = '7';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"personalsettings",&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"",&local_d1);
  ArgumentDictionary::get_string
            ((string *)local_88,(ArgumentDictionary *)pmVar1,&local_a8,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  if (bVar2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
               "./personal_settings.json");
  }
  std::ifstream::ifstream(&settings_json.m_value,(string *)local_88,_S_in);
  bVar2 = std::ios::operator_cast_to_bool
                    ((ios *)((long)&settings_json.m_value +
                            *(long *)(settings_json.m_value.number_integer + -0x18)));
  if (bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Personal settings: \'");
    poVar5 = std::operator<<(poVar5,(string *)local_88);
    std::operator<<(poVar5,"\'\n");
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)local_2f0,(nullptr_t)0x0);
    nlohmann::operator>>
              ((istream *)&settings_json.m_value.boolean,
               (basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_2f0);
    parse_json(this,(Json *)local_2f0);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)local_2f0);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"Could not open \'");
    poVar5 = std::operator<<(poVar5,(string *)local_88);
    std::operator<<(poVar5,"\', will use default values.\n");
  }
  pmVar1 = item_names_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"ingametracker",&local_311);
  bVar2 = ArgumentDictionary::contains((ArgumentDictionary *)pmVar1,&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  pmVar1 = item_names_local;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,"ingametracker",&local_339);
    bVar2 = ArgumentDictionary::get_boolean((ArgumentDictionary *)pmVar1,&local_338,false);
    this->_add_ingame_item_tracker = bVar2;
    std::__cxx11::string::~string((string *)&local_338);
    std::allocator<char>::~allocator(&local_339);
  }
  pmVar1 = item_names_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"hudcolor",
             (allocator<char> *)(hud_color_as_string.field_2._M_local_buf + 0xf));
  bVar2 = ArgumentDictionary::contains((ArgumentDictionary *)pmVar1,&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator
            ((allocator<char> *)(hud_color_as_string.field_2._M_local_buf + 0xf));
  pmVar1 = item_names_local;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"hudcolor",&local_3a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"",&local_3d1);
    ArgumentDictionary::get_string
              ((string *)local_388,(ArgumentDictionary *)pmVar1,&local_3a8,&local_3d0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::allocator<char>::~allocator(&local_3d1);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::allocator<char>::~allocator(&local_3a9);
    local_3d5 = parse_color_from_name_or_hex((string *)local_388);
    this->_hud_color = local_3d5;
    std::__cxx11::string::~string((string *)local_388);
  }
  pmVar1 = item_names_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f8,"nigelcolor",
             (allocator<char> *)(nigel_color_as_string.field_2._M_local_buf + 0xf));
  bVar2 = ArgumentDictionary::contains((ArgumentDictionary *)pmVar1,&local_3f8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)(nigel_color_as_string.field_2._M_local_buf + 0xf));
  pmVar1 = item_names_local;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,"nigelcolor",&local_441)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,"",&local_469);
    ArgumentDictionary::get_string
              ((string *)local_420,(ArgumentDictionary *)pmVar1,&local_440,&local_468);
    std::__cxx11::string::~string((string *)&local_468);
    std::allocator<char>::~allocator(&local_469);
    std::__cxx11::string::~string((string *)&local_440);
    std::allocator<char>::~allocator(&local_441);
    CVar3 = parse_color_from_name_or_hex((string *)local_420);
    (this->_nigel_colors).first = CVar3;
    CVar3 = Color::subtract(&(this->_nigel_colors).first,'@');
    (this->_nigel_colors).second = CVar3;
    std::__cxx11::string::~string((string *)local_420);
  }
  std::ifstream::~ifstream(&settings_json.m_value);
  std::__cxx11::string::~string((string *)local_88);
  return;
}

Assistant:

PersonalSettings::PersonalSettings(const ArgumentDictionary& args, const std::map<std::string, uint8_t>& item_names)
{
    _item_names = item_names;

    _inventory_order = {
            ITEM_RECORD_BOOK,   ITEM_SPELL_BOOK,
            ITEM_EKEEKE,        ITEM_DAHL,
            ITEM_GOLDEN_STATUE, ITEM_GAIA_STATUE,
            ITEM_RESTORATION,   ITEM_DETOX_GRASS,
            ITEM_MIND_REPAIR,   ITEM_ANTI_PARALYZE,
            ITEM_KEY,           ITEM_IDOL_STONE,
            ITEM_GARLIC,        ITEM_LOGS,
            ITEM_GOLA_EYE,      ITEM_GOLA_NAIL,
            ITEM_GOLA_HORN,     ITEM_GOLA_FANG,
            ITEM_DEATH_STATUE,  ITEM_CASINO_TICKET,
            ITEM_SHORT_CAKE,    ITEM_PAWN_TICKET,
            ITEM_ORACLE_STONE,  ITEM_LITHOGRAPH,
            ITEM_RED_JEWEL,     ITEM_PURPLE_JEWEL,
            ITEM_GREEN_JEWEL,   ITEM_BLUE_JEWEL,
            ITEM_YELLOW_JEWEL,  ITEM_SAFETY_PASS,
            ITEM_AXE_MAGIC,     ITEM_ARMLET,
            ITEM_SUN_STONE,     ITEM_BUYER_CARD,
            ITEM_LANTERN,       ITEM_EINSTEIN_WHISTLE,
            ITEM_STATUE_JYPTA,  ITEM_BELL,
            ITEM_BLUE_RIBBON,   0xFF
    };

    // Read settings from personal_settings.json file is it's present
    std::string settings_path = args.get_string("personalsettings");
    if(settings_path.empty())
        settings_path = "./personal_settings.json";

    std::ifstream personal_settings_file(settings_path);
    if(personal_settings_file)
    {
        std::cout << "Personal settings: '" << settings_path << "'\n";
        Json settings_json;
        personal_settings_file >> settings_json;
        this->parse_json(settings_json);
    }
    else
    {
        std::cout << "Could not open '"<< settings_path << "', will use default values.\n";
    }

    // Parse arguments from command line
    if(args.contains("ingametracker"))
        _add_ingame_item_tracker = args.get_boolean("ingametracker");

    if(args.contains("hudcolor"))
    {
        std::string hud_color_as_string = args.get_string("hudcolor");
        _hud_color = parse_color_from_name_or_hex(hud_color_as_string);
    }

    if(args.contains("nigelcolor"))
    {
        std::string nigel_color_as_string = args.get_string("nigelcolor");
        _nigel_colors.first = parse_color_from_name_or_hex(nigel_color_as_string);
        _nigel_colors.second = _nigel_colors.first.subtract(0x40);
    }
}